

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void arm_cpu_realizefn_arm(uc_struct_conflict1 *uc,CPUState *dev)

{
  byte *pbVar1;
  uint *puVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  TranslationBlock *pTVar6;
  TranslationBlock *pTVar7;
  gpointer pvVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  gsize __n;
  uint uVar12;
  long lVar13;
  bool bVar14;
  
  cpu_exec_realizefn_arm(dev);
  pTVar7 = dev[1].tb_jmp_cache[0x5f3];
  if ((((uint)pTVar7 >> 0x1c & 1) != 0) &&
     (*(char *)((long)dev[1].tb_jmp_cache + 0x317f) != *(char *)(dev[1].tb_jmp_cache + 0x630))) {
    return;
  }
  cVar3 = *(char *)((long)dev[1].tb_jmp_cache + 0x317f);
  if (cVar3 == '\0') {
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31f1);
    *pbVar1 = *pbVar1 & 0xf;
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31fa);
    *pbVar1 = *pbVar1 | 0xf;
    *(byte *)(dev[1].tb_jmp_cache + 0x637) = *(byte *)(dev[1].tb_jmp_cache + 0x637) & 0xf0;
    *(uint *)(dev[1].tb_jmp_cache + 0x63a) = *(uint *)(dev[1].tb_jmp_cache + 0x63a) & 0xf;
    puVar2 = (uint *)((long)dev[1].tb_jmp_cache + 0x31d4);
    *puVar2 = *puVar2 & 0xf0ffff00;
    *(byte *)(dev[1].tb_jmp_cache + 0x63b) = *(byte *)(dev[1].tb_jmp_cache + 0x63b) & 0xf;
  }
  if (*(char *)(dev[1].tb_jmp_cache + 0x630) == '\0') {
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)pTVar7 & 0xfffffffffffffeff);
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31ed);
    *pbVar1 = *pbVar1 & 0xf;
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31f2);
    *pbVar1 = *pbVar1 & 0xf0;
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31fa);
    *pbVar1 = *pbVar1 | 0xf0;
    *(undefined1 *)((long)dev[1].tb_jmp_cache + 0x31b7) = 0;
    *(uint *)(dev[1].tb_jmp_cache + 0x637) = *(uint *)(dev[1].tb_jmp_cache + 0x637) & 0xfffff00f;
    puVar2 = (uint *)((long)dev[1].tb_jmp_cache + 0x31d4);
    *puVar2 = *puVar2 & 0xff0000ff;
    *(byte *)(dev[1].tb_jmp_cache + 0x63b) = *(byte *)(dev[1].tb_jmp_cache + 0x63b) & 0xf0;
    if (cVar3 == '\0') {
      pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31ee);
      *pbVar1 = *pbVar1 & 0xf0;
      pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31f4);
      *pbVar1 = *pbVar1 & 0xf0;
      *(byte *)(dev[1].tb_jmp_cache + 0x63a) = *(byte *)(dev[1].tb_jmp_cache + 0x63a) & 0xf0;
      pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31d7);
      *pbVar1 = *pbVar1 & 0xf;
    }
  }
  if ((((uint)dev[1].tb_jmp_cache[0x5f3] >> 9 & 1) != 0) &&
     (*(char *)((long)dev[1].tb_jmp_cache + 0x3181) == '\0')) {
    dev[1].tb_jmp_cache[0x5f3] =
         (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] & 0xfffffffbffffffff);
    *(uint *)((long)dev[1].tb_jmp_cache + 0x31a4) =
         *(uint *)((long)dev[1].tb_jmp_cache + 0x31a4) & 0xffff0fff | 0x1000;
    *(undefined1 *)((long)dev[1].tb_jmp_cache + 0x31aa) = 0x11;
    *(undefined1 *)((long)dev[1].tb_jmp_cache + 0x31ac) = 0x10;
  }
  uVar5 = (uint)dev[1].tb_jmp_cache[0x5f3];
  if ((uVar5 >> 0x1b & 1) != 0) {
    uVar10 = 0x20;
    if ((uVar5 >> 9 & 1) == 0) {
      uVar10 = 0x2000;
    }
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)(uVar10 | (ulong)dev[1].tb_jmp_cache[0x5f3]);
  }
  uVar5 = (uint)dev[1].tb_jmp_cache[0x5f3];
  if ((uVar5 >> 0x1c & 1) == 0) {
    bVar14 = false;
  }
  else {
    bVar14 = ((ulong)dev[1].tb_jmp_cache[0x63f] & 0xe) == 0;
  }
  if ((uVar5 >> 0xd & 1) != 0) {
    if ((!bVar14) && ((*(byte *)((long)dev[1].tb_jmp_cache + 0x31a3) & 0xe) == 0)) {
      __assert_fail("no_aa32 || cpu_isar_feature(aa32_arm_div, cpu)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                    ,0x3bb,"void arm_cpu_realizefn_arm(struct uc_struct *, CPUState *)");
    }
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] | 0x4000020)
    ;
  }
  pTVar7 = dev[1].tb_jmp_cache[0x5f3];
  if (((ulong)pTVar7 & 0x20) != 0) {
    dev[1].tb_jmp_cache[0x5f3] =
         (TranslationBlock *)
         ((ulong)(((uint)pTVar7 >> 9 & 1) == 0) * 8 + 0x1020048 | (ulong)pTVar7 | 0x1000000000);
  }
  if (((ulong)dev[1].tb_jmp_cache[0x5f3] & 0x10) != 0) {
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] | 0x80008);
  }
  pTVar7 = dev[1].tb_jmp_cache[0x5f3];
  if ((((ulong)pTVar7 & 8) != 0) &&
     (dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)pTVar7 | 0x8000),
     ((uint)pTVar7 >> 9 & 1) == 0)) {
    if ((!bVar14) && (*(uint *)((long)dev[1].tb_jmp_cache + 0x31a4) < 0x10000000)) {
      __assert_fail("no_aa32 || cpu_isar_feature(aa32_jazelle, cpu)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                    ,0x3d7,"void arm_cpu_realizefn_arm(struct uc_struct *, CPUState *)");
    }
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)pTVar7 | 0x8001);
  }
  if ((short)dev[1].tb_jmp_cache[0x5f3] < 0) {
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] | 0x4000);
  }
  if (((uint)dev[1].tb_jmp_cache[0x5f3] >> 0x1a & 1) != 0) {
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] | 0x2001000)
    ;
  }
  if ((int)dev[1].tb_jmp_cache[0x5f3] < 0) {
    dev[1].tb_jmp_cache[0x5f3] =
         (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] | 0x20000000);
  }
  if (((uint)dev[1].tb_jmp_cache[0x5f3] & 0x240) == 0x40) {
    dev[1].tb_jmp_cache[0x5f3] =
         (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] | 0x400000000);
  }
  pTVar7 = dev[1].tb_jmp_cache[0x5f3];
  if (((((uint)pTVar7 >> 0x1c & 1) == 0) && (((ulong)pTVar7 & 2) != 0)) &&
     (((ulong)dev[1].tb_jmp_cache[0x63a] & 0xf) != 0)) {
    __assert_fail("arm_feature(&cpu->env, ARM_FEATURE_AARCH64) || !cpu_isar_feature(aa32_vfp_simd, cpu) || !arm_feature(env, ARM_FEATURE_XSCALE)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                  ,0x3f1,"void arm_cpu_realizefn_arm(struct uc_struct *, CPUState *)");
  }
  if (dev[1].tb_jmp_cache[0x650] == (TranslationBlock *)0xffffff00ff000000) {
    iVar4 = dev->cpu_index;
    iVar9 = iVar4 + 7;
    if (-1 < iVar4) {
      iVar9 = iVar4;
    }
    dev[1].tb_jmp_cache[0x650] = (TranslationBlock *)(ulong)(uint)((iVar9 >> 3) << 8 | iVar4 % 8);
  }
  if (*(char *)((long)dev[1].tb_jmp_cache + 0x3314) == '\x01') {
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x3241);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (*(char *)((long)dev[1].tb_jmp_cache + 0x3334) == '\x01') {
    uVar5 = 0x2000000;
    if (((ulong)pTVar7 & 0x20) == 0) {
      uVar5 = 0x80;
    }
    *(uint *)(dev[1].tb_jmp_cache + 0x648) = *(uint *)(dev[1].tb_jmp_cache + 0x648) | uVar5;
  }
  if (*(char *)((long)dev[1].tb_jmp_cache + 0x317d) == '\0') {
    dev[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)pTVar7 & 0xfffffffdffffffff);
    *(byte *)(dev[1].tb_jmp_cache + 0x649) = *(byte *)(dev[1].tb_jmp_cache + 0x649) & 0xf;
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31f9);
    *pbVar1 = *pbVar1 & 0xf;
  }
  if (*(char *)((long)dev[1].tb_jmp_cache + 0x317c) == '\0') {
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x2f9c);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  if (*(char *)((long)dev[1].tb_jmp_cache + 0x317e) == '\0') {
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x2f9c);
    *pbVar1 = *pbVar1 & 0xf7;
  }
  if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x2f9c) & 8) == 0) {
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x3221);
    *pbVar1 = *pbVar1 & 0xf0;
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31df);
    *pbVar1 = *pbVar1 & 0xf0;
    dev[1].tb_jmp_cache[0x64a] = (TranslationBlock *)0x0;
    dev[1].tb_jmp_cache[0x64b] = (TranslationBlock *)0x0;
  }
  else {
    pmu_init_arm((ARMCPU *)dev);
    pTVar6 = (TranslationBlock *)g_malloc0(0x20);
    pTVar6->pc = (target_ulong)pmu_pre_el_change_arm;
    pTVar6->cs_base = 0;
    pTVar7 = dev[1].tb_jmp_cache[0x667];
    *(TranslationBlock **)&pTVar6->flags = pTVar7;
    if (pTVar7 != (TranslationBlock *)0x0) {
      *(uint32_t **)&pTVar7->cflags = &pTVar6->flags;
    }
    dev[1].tb_jmp_cache[0x667] = pTVar6;
    *(TranslationBlock ***)&pTVar6->cflags = dev[1].tb_jmp_cache + 0x667;
    pTVar6 = (TranslationBlock *)g_malloc0(0x20);
    pTVar6->pc = (target_ulong)pmu_post_el_change_arm;
    pTVar6->cs_base = 0;
    pTVar7 = dev[1].tb_jmp_cache[0x668];
    *(TranslationBlock **)&pTVar6->flags = pTVar7;
    if (pTVar7 != (TranslationBlock *)0x0) {
      *(uint32_t **)&pTVar7->cflags = &pTVar6->flags;
    }
    dev[1].tb_jmp_cache[0x668] = pTVar6;
    *(TranslationBlock ***)&pTVar6->cflags = dev[1].tb_jmp_cache + 0x668;
  }
  pTVar7 = dev[1].tb_jmp_cache[0x5f3];
  if (((ulong)pTVar7 >> 0x20 & 1) == 0) {
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x31f9);
    *pbVar1 = *pbVar1 & 0xf0;
    pbVar1 = (byte *)((long)dev[1].tb_jmp_cache + 0x3249);
    *pbVar1 = *pbVar1 & 0xf;
  }
  if (*(char *)((long)dev[1].tb_jmp_cache + 0x3182) == '\0') {
    *(undefined4 *)((long)dev[1].tb_jmp_cache + 0x3184) = 0;
  }
  uVar5 = *(uint *)((long)dev[1].tb_jmp_cache + 0x3184);
  uVar10 = (ulong)uVar5;
  if (uVar10 == 0) {
    *(undefined1 *)((long)dev[1].tb_jmp_cache + 0x3182) = 0;
  }
  uVar12 = (uint)pTVar7;
  if ((~uVar12 & 0xa0) == 0) {
    if (0xff < uVar5) {
      return;
    }
    if (uVar10 != 0) {
      pTVar7 = (TranslationBlock *)g_malloc0_n(uVar10,4);
      if ((uVar12 >> 0x1b & 1) == 0) {
        dev[1].tb_jmp_cache[0x5f4] = pTVar7;
        lVar13 = 0xb2a8;
        lVar11 = 0xb2a0;
      }
      else {
        dev[1].tb_jmp_cache[0x5f8] = pTVar7;
        pTVar7 = (TranslationBlock *)g_malloc0_n(uVar10,4);
        dev[1].tb_jmp_cache[0x5fa] = pTVar7;
        if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x2f9c) & 0x20) == 0) goto LAB_0057fb87;
        lVar13 = 0xb2d0;
        lVar11 = 0xb2c0;
      }
      pvVar8 = g_malloc0_n(uVar10,4);
      *(gpointer *)((long)dev->jmp_env[0].__jmpbuf + lVar11 + -0x40) = pvVar8;
      pvVar8 = g_malloc0_n(uVar10,4);
      *(gpointer *)((long)dev->jmp_env[0].__jmpbuf + lVar13 + -0x40) = pvVar8;
    }
  }
LAB_0057fb87:
  if ((*(byte *)((long)dev[1].tb_jmp_cache + 0x2f9c) & 0x20) != 0) {
    uVar10 = (ulong)*(uint *)(dev[1].tb_jmp_cache + 0x631);
    if (0xff < uVar10) {
      return;
    }
    if (uVar10 != 0) {
      pTVar7 = (TranslationBlock *)g_malloc0_n(uVar10,4);
      dev[1].tb_jmp_cache[0x5fe] = pTVar7;
      pTVar7 = (TranslationBlock *)g_malloc0_n(uVar10,4);
      dev[1].tb_jmp_cache[0x5ff] = pTVar7;
    }
  }
  if (((ulong)dev[1].tb_jmp_cache[0x5f3] >> 0x21 & 1) != 0) {
    dev[1].tb_jmp_cache[0x5f3] =
         (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x5f3] | 0x1000000000);
  }
  register_cp_regs_for_features_arm((ARMCPU *)dev);
  if ((*(char *)((long)dev[1].tb_jmp_cache + 0x317d) == '\0') &&
     (((ulong)dev[1].tb_jmp_cache[0x5f3] & 0x2000000000) == 0)) {
    dev->num_ases = 1;
  }
  else {
    dev->num_ases = 2;
    if (dev[1].tb_jmp_cache[0x62c] == (TranslationBlock *)0x0) {
      dev[1].tb_jmp_cache[0x62c] = (TranslationBlock *)dev->memory;
    }
    cpu_address_space_init_arm(dev,1,(MemoryRegion *)dev[1].tb_jmp_cache[0x62c]);
  }
  cpu_address_space_init_arm(dev,0,dev->memory);
  if (*(int *)(dev[1].tb_jmp_cache + 0x633) == -1) {
    *(undefined4 *)(dev[1].tb_jmp_cache + 0x633) = 1;
  }
  cpu_reset(dev);
  return;
}

Assistant:

void arm_cpu_realizefn(struct uc_struct *uc, CPUState *dev)
{
    CPUState *cs = CPU(dev);
    ARMCPU *cpu = ARM_CPU(dev);
    CPUARMState *env = &cpu->env;
#ifndef NDEBUG
    bool no_aa32 = false;
#endif

#if 0
    /* The NVIC and M-profile CPU are two halves of a single piece of
     * hardware; trying to use one without the other is a command line
     * error and will result in segfaults if not caught here.
     */
    if (arm_feature(env, ARM_FEATURE_M)) {
        if (!env->nvic) {
            return;
        }
    } else {
        if (env->nvic) {
            return;
        }
    }

    if (arm_feature(env, ARM_FEATURE_GENERIC_TIMER)) {
        if (!cpu->gt_cntfrq_hz) {
            return;
        }
    }
#endif

    cpu_exec_realizefn(cs);

    arm_cpu_finalize_features(cpu);

    if (arm_feature(env, ARM_FEATURE_AARCH64) &&
        cpu->has_vfp != cpu->has_neon) {
        /*
         * This is an architectural requirement for AArch64; AArch32 is
         * more flexible and permits VFP-no-Neon and Neon-no-VFP.
         */
        // error_setg(errp, "AArch64 CPUs must have both VFP and Neon or neither");
        return;
    }

    if (!cpu->has_vfp) {
        uint64_t t;
        uint32_t u;

        t = cpu->isar.id_aa64isar1;
        FIELD_DP64(t, ID_AA64ISAR1, JSCVT, 0, t);
        cpu->isar.id_aa64isar1 = t;

        t = cpu->isar.id_aa64pfr0;
        FIELD_DP64(t, ID_AA64PFR0, FP, 0xf, t);
        cpu->isar.id_aa64pfr0 = t;

        u = cpu->isar.id_isar6;
        FIELD_DP32(u, ID_ISAR6, JSCVT, 0, u);
        cpu->isar.id_isar6 = u;

        u = cpu->isar.mvfr0;
        FIELD_DP32(u, MVFR0, FPSP, 0, u);
        FIELD_DP32(u, MVFR0, FPDP, 0, u);
        FIELD_DP32(u, MVFR0, FPTRAP, 0, u);
        FIELD_DP32(u, MVFR0, FPDIVIDE, 0, u);
        FIELD_DP32(u, MVFR0, FPSQRT, 0, u);
        FIELD_DP32(u, MVFR0, FPSHVEC, 0, u);
        FIELD_DP32(u, MVFR0, FPROUND, 0, u);
        cpu->isar.mvfr0 = u;

        u = cpu->isar.mvfr1;
        FIELD_DP32(u, MVFR1, FPFTZ, 0, u);
        FIELD_DP32(u, MVFR1, FPDNAN, 0, u);
        FIELD_DP32(u, MVFR1, FPHP, 0, u);
        cpu->isar.mvfr1 = u;

        u = cpu->isar.mvfr2;
        FIELD_DP32(u, MVFR2, FPMISC, 0, u);
        cpu->isar.mvfr2 = u;
    }

    if (!cpu->has_neon) {
        uint64_t t;
        uint32_t u;

        unset_feature(env, ARM_FEATURE_NEON);

        t = cpu->isar.id_aa64isar0;
        FIELD_DP64(t, ID_AA64ISAR0, DP, 0, t);
        cpu->isar.id_aa64isar0 = t;

        t = cpu->isar.id_aa64isar1;
        FIELD_DP64(t, ID_AA64ISAR1, FCMA, 0, t);
        cpu->isar.id_aa64isar1 = t;

        t = cpu->isar.id_aa64pfr0;
        FIELD_DP64(t, ID_AA64PFR0, ADVSIMD, 0xf, t);
        cpu->isar.id_aa64pfr0 = t;

        u = cpu->isar.id_isar5;
        FIELD_DP32(u, ID_ISAR5, RDM, 0, u);
        FIELD_DP32(u, ID_ISAR5, VCMA, 0, u);
        cpu->isar.id_isar5 = u;

        u = cpu->isar.id_isar6;
        FIELD_DP32(u, ID_ISAR6, DP, 0, u);
        FIELD_DP32(u, ID_ISAR6, FHM, 0, u);
        cpu->isar.id_isar6 = u;

        u = cpu->isar.mvfr1;
        FIELD_DP32(u, MVFR1, SIMDLS, 0, u);
        FIELD_DP32(u, MVFR1, SIMDINT, 0, u);
        FIELD_DP32(u, MVFR1, SIMDSP, 0, u);
        FIELD_DP32(u, MVFR1, SIMDHP, 0, u);
        cpu->isar.mvfr1 = u;

        u = cpu->isar.mvfr2;
        FIELD_DP32(u, MVFR2, SIMDMISC, 0, u);
        cpu->isar.mvfr2 = u;
    }

    if (!cpu->has_neon && !cpu->has_vfp) {
        uint64_t t;
        uint32_t u;

        t = cpu->isar.id_aa64isar0;
        FIELD_DP64(t, ID_AA64ISAR0, FHM, 0, t);
        cpu->isar.id_aa64isar0 = t;

        t = cpu->isar.id_aa64isar1;
        FIELD_DP64(t, ID_AA64ISAR1, FRINTTS, 0, t);
        cpu->isar.id_aa64isar1 = t;

        u = cpu->isar.mvfr0;
        FIELD_DP32(u, MVFR0, SIMDREG, 0, u);
        cpu->isar.mvfr0 = u;

        /* Despite the name, this field covers both VFP and Neon */
        u = cpu->isar.mvfr1;
        FIELD_DP32(u, MVFR1, SIMDFMAC, 0, u);
        cpu->isar.mvfr1 = u;
    }

    if (arm_feature(env, ARM_FEATURE_M) && !cpu->has_dsp) {
        uint32_t u;

        unset_feature(env, ARM_FEATURE_THUMB_DSP);

        u = cpu->isar.id_isar1;
        FIELD_DP32(u, ID_ISAR1, EXTEND, 1, u);
        cpu->isar.id_isar1 = u;

        u = cpu->isar.id_isar2;
        FIELD_DP32(u, ID_ISAR2, MULTU, 1, u);
        FIELD_DP32(u, ID_ISAR2, MULTS, 1, u);
        cpu->isar.id_isar2 = u;

        u = cpu->isar.id_isar3;
        FIELD_DP32(u, ID_ISAR3, SIMD, 1, u);
        FIELD_DP32(u, ID_ISAR3, SATURATE, 0, u);
        cpu->isar.id_isar3 = u;
    }

    /* Some features automatically imply others: */
    if (arm_feature(env, ARM_FEATURE_V8)) {
        if (arm_feature(env, ARM_FEATURE_M)) {
            set_feature(env, ARM_FEATURE_V7);
        } else {
            set_feature(env, ARM_FEATURE_V7VE);
        }
    }

    /*
     * There exist AArch64 cpus without AArch32 support.  When KVM
     * queries ID_ISAR0_EL1 on such a host, the value is UNKNOWN.
     * Similarly, we cannot check ID_AA64PFR0 without AArch64 support.
     * As a general principle, we also do not make ID register
     * consistency checks anywhere unless using TCG, because only
     * for TCG would a consistency-check failure be a QEMU bug.
     */
    if (arm_feature(&cpu->env, ARM_FEATURE_AARCH64)) {
#ifndef NDEBUG
        no_aa32 = !cpu_isar_feature(aa64_aa32, cpu);
#else
        cpu_isar_feature(aa64_aa32, cpu);
#endif
    }

    if (arm_feature(env, ARM_FEATURE_V7VE)) {
        /* v7 Virtualization Extensions. In real hardware this implies
         * EL2 and also the presence of the Security Extensions.
         * For QEMU, for backwards-compatibility we implement some
         * CPUs or CPU configs which have no actual EL2 or EL3 but do
         * include the various other features that V7VE implies.
         * Presence of EL2 itself is ARM_FEATURE_EL2, and of the
         * Security Extensions is ARM_FEATURE_EL3.
         */
#ifndef NDEBUG
        assert(no_aa32 || cpu_isar_feature(aa32_arm_div, cpu));
#endif
        set_feature(env, ARM_FEATURE_LPAE);
        set_feature(env, ARM_FEATURE_V7);
    }
    if (arm_feature(env, ARM_FEATURE_V7)) {
        set_feature(env, ARM_FEATURE_VAPA);
        set_feature(env, ARM_FEATURE_THUMB2);
        set_feature(env, ARM_FEATURE_MPIDR);
        if (!arm_feature(env, ARM_FEATURE_M)) {
            set_feature(env, ARM_FEATURE_V6K);
        } else {
            set_feature(env, ARM_FEATURE_V6);
        }

        /* Always define VBAR for V7 CPUs even if it doesn't exist in
         * non-EL3 configs. This is needed by some legacy boards.
         */
        set_feature(env, ARM_FEATURE_VBAR);
    }
    if (arm_feature(env, ARM_FEATURE_V6K)) {
        set_feature(env, ARM_FEATURE_V6);
        set_feature(env, ARM_FEATURE_MVFR);
    }
    if (arm_feature(env, ARM_FEATURE_V6)) {
        set_feature(env, ARM_FEATURE_V5);
        if (!arm_feature(env, ARM_FEATURE_M)) {
#ifndef NDEBUG
            assert(no_aa32 || cpu_isar_feature(aa32_jazelle, cpu));
#endif
            set_feature(env, ARM_FEATURE_AUXCR);
        }
    }
    if (arm_feature(env, ARM_FEATURE_V5)) {
        set_feature(env, ARM_FEATURE_V4T);
    }
    if (arm_feature(env, ARM_FEATURE_LPAE)) {
        set_feature(env, ARM_FEATURE_V7MP);
        set_feature(env, ARM_FEATURE_PXN);
    }
    if (arm_feature(env, ARM_FEATURE_CBAR_RO)) {
        set_feature(env, ARM_FEATURE_CBAR);
    }
    if (arm_feature(env, ARM_FEATURE_THUMB2) &&
        !arm_feature(env, ARM_FEATURE_M)) {
        set_feature(env, ARM_FEATURE_THUMB_DSP);
    }

    /*
     * We rely on no XScale CPU having VFP so we can use the same bits in the
     * TB flags field for VECSTRIDE and XSCALE_CPAR.
     */
    assert(arm_feature(&cpu->env, ARM_FEATURE_AARCH64) ||
           !cpu_isar_feature(aa32_vfp_simd, cpu) ||
           !arm_feature(env, ARM_FEATURE_XSCALE));

#if 0
    if (arm_feature(env, ARM_FEATURE_V7) &&
        !arm_feature(env, ARM_FEATURE_M) &&
        !arm_feature(env, ARM_FEATURE_PMSA)) {
        /* v7VMSA drops support for the old ARMv5 tiny pages, so we
         * can use 4K pages.
         */
        pagebits = 12;
    } else {
        /* For CPUs which might have tiny 1K pages, or which have an
         * MPU and might have small region sizes, stick with 1K pages.
         */
        pagebits = 10;
    }

    if (!set_preferred_target_page_bits(cpu->uc, pagebits)) {
        /* This can only ever happen for hotplugging a CPU, or if
         * the board code incorrectly creates a CPU which it has
         * promised via minimum_page_size that it will not.
         */
        // error_setg(errp, "This CPU requires a smaller page size than the "
        //            "system is using");
        return;
    }
#endif

    /* This cpu-id-to-MPIDR affinity is used only for TCG; KVM will override it.
     * We don't support setting cluster ID ([16..23]) (known as Aff2
     * in later ARM ARM versions), or any of the higher affinity level fields,
     * so these bits always RAZ.
     */
    if (cpu->mp_affinity == ARM64_AFFINITY_INVALID) {
        cpu->mp_affinity = arm_cpu_mp_affinity(cs->cpu_index,
                                               ARM_DEFAULT_CPUS_PER_CLUSTER);
    }

    if (cpu->reset_hivecs) {
            cpu->reset_sctlr |= (1 << 13);
    }

    if (cpu->cfgend) {
        if (arm_feature(&cpu->env, ARM_FEATURE_V7)) {
            cpu->reset_sctlr |= SCTLR_EE;
        } else {
            cpu->reset_sctlr |= SCTLR_B;
        }
    }

    if (!cpu->has_el3) {
        /* If the has_el3 CPU property is disabled then we need to disable the
         * feature.
         */
        unset_feature(env, ARM_FEATURE_EL3);

        /* Disable the security extension feature bits in the processor feature
         * registers as well. These are id_pfr1[7:4] and id_aa64pfr0[15:12].
         */
        cpu->id_pfr1 &= ~0xf0;
        cpu->isar.id_aa64pfr0 &= ~0xf000;
    }

    if (!cpu->has_el2) {
        unset_feature(env, ARM_FEATURE_EL2);
    }

    if (!cpu->has_pmu) {
        unset_feature(env, ARM_FEATURE_PMU);
    }
    if (arm_feature(env, ARM_FEATURE_PMU)) {
        pmu_init(cpu);

        arm_register_pre_el_change_hook(cpu, &pmu_pre_el_change, 0);
        arm_register_el_change_hook(cpu, &pmu_post_el_change, 0);
    } else {
        FIELD_DP64(cpu->isar.id_aa64dfr0, ID_AA64DFR0, PMUVER, 0, cpu->isar.id_aa64dfr0);
        FIELD_DP32(cpu->isar.id_dfr0, ID_DFR0, PERFMON, 0, cpu->isar.id_dfr0);
        cpu->pmceid0 = 0;
        cpu->pmceid1 = 0;
    }

    if (!arm_feature(env, ARM_FEATURE_EL2)) {
        /* Disable the hypervisor feature bits in the processor feature
         * registers if we don't have EL2. These are id_pfr1[15:12] and
         * id_aa64pfr0_el1[11:8].
         */
        cpu->isar.id_aa64pfr0 &= ~0xf00;
        cpu->id_pfr1 &= ~0xf000;
    }

    /* MPU can be configured out of a PMSA CPU either by setting has-mpu
     * to false or by setting pmsav7-dregion to 0.
     */
    if (!cpu->has_mpu) {
        cpu->pmsav7_dregion = 0;
    }
    if (cpu->pmsav7_dregion == 0) {
        cpu->has_mpu = false;
    }

    if (arm_feature(env, ARM_FEATURE_PMSA) &&
        arm_feature(env, ARM_FEATURE_V7)) {
        uint32_t nr = cpu->pmsav7_dregion;

        if (nr > 0xff) {
            // error_setg(errp, "PMSAv7 MPU #regions invalid %" PRIu32, nr);
            return;
        }

        if (nr) {
            if (arm_feature(env, ARM_FEATURE_V8)) {
                /* PMSAv8 */
                env->pmsav8.rbar[M_REG_NS] = g_new0(uint32_t, nr);
                env->pmsav8.rlar[M_REG_NS] = g_new0(uint32_t, nr);
                if (arm_feature(env, ARM_FEATURE_M_SECURITY)) {
                    env->pmsav8.rbar[M_REG_S] = g_new0(uint32_t, nr);
                    env->pmsav8.rlar[M_REG_S] = g_new0(uint32_t, nr);
                }
            } else {
                env->pmsav7.drbar = g_new0(uint32_t, nr);
                env->pmsav7.drsr = g_new0(uint32_t, nr);
                env->pmsav7.dracr = g_new0(uint32_t, nr);
            }
        }
    }

    if (arm_feature(env, ARM_FEATURE_M_SECURITY)) {
        uint32_t nr = cpu->sau_sregion;

        if (nr > 0xff) {
            // error_setg(errp, "v8M SAU #regions invalid %" PRIu32, nr);
            return;
        }

        if (nr) {
            env->sau.rbar = g_new0(uint32_t, nr);
            env->sau.rlar = g_new0(uint32_t, nr);
        }
    }

    if (arm_feature(env, ARM_FEATURE_EL3)) {
        set_feature(env, ARM_FEATURE_VBAR);
    }

    register_cp_regs_for_features(cpu);

    unsigned int smp_cpus = 1;

    if (cpu->has_el3 || arm_feature(env, ARM_FEATURE_M_SECURITY)) {
        cs->num_ases = 2;

        if (!cpu->secure_memory) {
            cpu->secure_memory = cs->memory;
        }
        cpu_address_space_init(cs, ARMASIdx_S, cpu->secure_memory);
    } else {
        cs->num_ases = 1;
    }
    cpu_address_space_init(cs, ARMASIdx_NS, cs->memory);

    /* No core_count specified, default to smp_cpus. */
    if (cpu->core_count == -1) {
        cpu->core_count = smp_cpus;
    }

    cpu_reset(cs);
}